

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O2

ConstantValue * __thiscall
slang::ast::Bitstream::evaluateCast
          (ConstantValue *__return_storage_ptr__,Bitstream *this,Type *type,ConstantValue *value,
          SourceRange sourceRange,EvalContext *context,bool isImplicit)

{
  SourceRange range;
  SourceRange range_00;
  bool bVar1;
  size_t sVar2;
  size_t arg;
  Diagnostic *pDVar3;
  size_t sVar4;
  int line;
  char *expr;
  ulong uVar5;
  pair<unsigned_long,_unsigned_long> pVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  size_t dynamicSize;
  bitwidth_t bitOffset;
  SourceLocation local_90;
  SourceLocation local_88;
  SourceLocation local_80;
  const_iterator iter;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  
  local_90 = sourceRange.endLoc;
  local_80 = sourceRange.startLoc;
  local_88 = (SourceLocation)value;
  sVar2 = ConstantValue::bitstreamWidth((ConstantValue *)type);
  dynamicSize = 0;
  if ((char)context != '\0') {
    arg = Type::bitstreamWidth((Type *)this);
    sVar4 = dynamicSize;
    if ((arg <= sVar2 && sVar2 - arg != 0) &&
       (bVar1 = Type::isFixedSize((Type *)this), sVar4 = sVar2 - arg, bVar1)) {
      range.endLoc = local_80;
      range.startLoc = local_88;
      pDVar3 = EvalContext::addDiag((EvalContext *)local_90,(DiagCode)0x2b0007,range);
      pDVar3 = Diagnostic::operator<<(pDVar3,arg);
      Diagnostic::operator<<(pDVar3,sVar2);
      goto LAB_001e0878;
    }
    goto LAB_001e0894;
  }
  bVar1 = Type::isFixedSize((Type *)this);
  if (bVar1) {
    sVar4 = Type::bitstreamWidth((Type *)this);
    dynamicSize = 0;
    if (sVar4 != sVar2) {
      dynamicSize = sVar2 + 1;
    }
    goto LAB_001e081f;
  }
  pVar6 = dynamicBitstreamSize((Type *)this,DestEmpty);
  uVar5 = sVar2 - pVar6.second;
  if (sVar2 < pVar6.second) {
LAB_001e083e:
    range_00.endLoc = local_80;
    range_00.startLoc = local_88;
    pDVar3 = EvalContext::addDiag((EvalContext *)local_90,(DiagCode)0x3000c,range_00);
    sVar2 = ConstantValue::bitstreamWidth((ConstantValue *)type);
    pDVar3 = Diagnostic::operator<<(pDVar3,sVar2);
    ast::operator<<(pDVar3,(Type *)this);
LAB_001e0878:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  if (uVar5 == 0) {
LAB_001e088e:
    dynamicSize = 0;
    sVar4 = dynamicSize;
  }
  else {
    pVar7 = dynamicBitstreamSize((Type *)this,DestFill);
    dynamicSize = sVar2 - pVar7.second;
    if ((sVar2 < pVar7.second) || (dynamicSize % pVar7.first != 0)) {
      if ((pVar6.first != 0) && (uVar5 % pVar6.first == 0)) goto LAB_001e088e;
      dynamicSize = sVar2 + 1;
    }
LAB_001e081f:
    sVar4 = dynamicSize;
    if (sVar2 < dynamicSize) goto LAB_001e083e;
  }
LAB_001e0894:
  dynamicSize = sVar4;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ =
       (pointer)packed.super_SmallVectorBase<slang::ConstantValue_*>.firstElement;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.len = 0;
  packed.super_SmallVectorBase<slang::ConstantValue_*>.cap = 5;
  packBitstream((ConstantValue *)type,&packed.super_SmallVectorBase<slang::ConstantValue_*>);
  bitOffset = 0;
  iter = packed.super_SmallVectorBase<slang::ConstantValue_*>.data_;
  unpackBitstream(__return_storage_ptr__,(Type *)this,&iter,
                  packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                  packed.super_SmallVectorBase<slang::ConstantValue_*>.len,&bitOffset,&dynamicSize);
  if (dynamicSize == 0) {
    if ((char)context == '\0') {
      line = 0x1b9;
      expr = "isImplicit || (iter == std::cend(packed) && !bitOffset)";
      if ((iter != packed.super_SmallVectorBase<slang::ConstantValue_*>.data_ +
                   packed.super_SmallVectorBase<slang::ConstantValue_*>.len) || (bitOffset != 0))
      goto LAB_001e0995;
    }
    SmallVectorBase<slang::ConstantValue_*>::~SmallVectorBase
              (&packed.super_SmallVectorBase<slang::ConstantValue_*>);
    return __return_storage_ptr__;
  }
  line = 0x1b8;
  expr = "!dynamicSize";
LAB_001e0995:
  assert::assertFailed
            (expr,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Bitstream.cpp"
             ,line,
             "static ConstantValue slang::ast::Bitstream::evaluateCast(const Type &, ConstantValue &&, SourceRange, EvalContext &, bool)"
            );
}

Assistant:

ConstantValue Bitstream::evaluateCast(const Type& type, ConstantValue&& value,
                                      SourceRange sourceRange, EvalContext& context,
                                      bool isImplicit) {
    auto srcSize = value.bitstreamWidth();
    size_t dynamicSize = 0;
    if (!isImplicit) { // Explicit bit-stream casting
        dynamicSize = bitstreamCastRemainingSize(type, srcSize);
        if (dynamicSize > srcSize) {
            context.addDiag(diag::ConstEvalBitstreamCastSize, sourceRange)
                << value.bitstreamWidth() << type;
            return nullptr;
        }
    }
    else { // implicit streaming concatenation conversion
        auto targetWidth = type.bitstreamWidth();
        if (targetWidth < srcSize) {
            if (type.isFixedSize()) {
                context.addDiag(diag::BadStreamSize, sourceRange) << targetWidth << srcSize;
                return nullptr;
            }
            dynamicSize = srcSize - targetWidth;
        }
    }

    SmallVector<ConstantValue*> packed;
    packBitstream(value, packed);

    bitwidth_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto cv = unpackBitstream(type, iter, std::cend(packed), bitOffset, dynamicSize);
    ASSERT(!dynamicSize);
    ASSERT(isImplicit || (iter == std::cend(packed) && !bitOffset));
    return cv;
}